

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O2

void write_cstring(char *s,int length)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  int __c;
  int __c_00;
  ulong uVar5;
  int iVar6;
  
  if (varused_test != 0) {
    varused = 1;
    return;
  }
  putc(0x22,(FILE *)code_file);
  iVar6 = 1;
  pbVar3 = (byte *)s;
LAB_00193d28:
  if (s + length <= pbVar3) {
    putc(0x22,(FILE *)code_file);
    return;
  }
  pbVar1 = pbVar3 + 1;
  bVar2 = *pbVar3;
  __c = (int)(char)bVar2;
  switch(bVar2) {
  case 8:
    __c_00 = 0x62;
    break;
  case 9:
    __c_00 = 0x74;
    break;
  case 10:
    __c_00 = 0x6e;
    break;
  case 0xb:
switchD_00193d4b_caseD_b:
    if ((byte)(bVar2 - 0x20) < 0x5f) goto LAB_00193f05;
    uVar5 = (ulong)bVar2;
    if (bVar2 < 8) {
      if (0x4b < iVar6) {
        fputs("\\\n",(FILE *)code_file);
        iVar6 = 0;
      }
      fprintf((FILE *)code_file,"\\%o",uVar5);
      iVar6 = iVar6 + 2;
    }
    else if (bVar2 < 0x40) {
      if (0x4a < iVar6) {
        fputs("\\\n",(FILE *)code_file);
        iVar6 = 0;
      }
      fprintf((FILE *)code_file,"\\%o",uVar5);
      iVar6 = iVar6 + 3;
    }
    else {
      if (0x49 < iVar6) {
        fputs("\\\n",(FILE *)code_file);
        iVar6 = 0;
      }
      fprintf((FILE *)code_file,"\\%o",uVar5);
      iVar6 = iVar6 + 4;
    }
    pbVar3 = pbVar1;
    if ((pbVar1 < s + length) &&
       (((byte)(*pbVar1 - 0x30) < 10 ||
        ((uVar4 = *pbVar1 - 0x41, uVar4 < 0x26 &&
         ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) != 0)))))) {
      __c_00 = 0x22;
      putc(0x22,(FILE *)code_file);
      goto LAB_00193ee5;
    }
    goto LAB_00193d28;
  case 0xc:
    __c_00 = 0x66;
    break;
  case 0xd:
    __c_00 = 0x72;
    break;
  default:
    __c_00 = __c;
    if ((bVar2 != 0x22) && (bVar2 != 0x27)) {
      if (bVar2 == 0x3f) {
        if ((pbVar3 + -1 < s) || (__c_00 = 0x3f, pbVar3[-1] != 0x3f)) goto LAB_00193f05;
      }
      else if (bVar2 != 0x5c) goto switchD_00193d4b_caseD_b;
    }
  }
  if (0x4c < iVar6) {
    fputs("\\\n",(FILE *)code_file);
    iVar6 = 0;
  }
  putc(0x5c,(FILE *)code_file);
LAB_00193ee5:
  putc(__c_00,(FILE *)code_file);
  iVar6 = iVar6 + 2;
  pbVar3 = pbVar1;
  goto LAB_00193d28;
LAB_00193f05:
  if (0x4d < iVar6) {
    fputs("\\\n",(FILE *)code_file);
    iVar6 = 0;
  }
  putc(__c,(FILE *)code_file);
  iVar6 = iVar6 + 1;
  pbVar3 = pbVar1;
  goto LAB_00193d28;
}

Assistant:

void write_cstring(const char *s, int length) {
  if (varused_test) {
    varused = 1;
    return;
  }
  const char *p = s;
  const char *e = s+length;
  int linelength = 1;
  putc('\"', code_file);
  for (; p < e;) {
    int c = *p++;
    switch (c) {
    case '\b': c = 'b'; goto QUOTED;
    case '\t': c = 't'; goto QUOTED;
    case '\n': c = 'n'; goto QUOTED;
    case '\f': c = 'f'; goto QUOTED;
    case '\r': c = 'r'; goto QUOTED;
    case '\"':
    case '\'':
    case '\\':
    QUOTED:
      if (linelength >= 77) {fputs("\\\n",code_file); linelength = 0;}
      putc('\\', code_file);
      putc(c, code_file);
      linelength += 2;
      break;
    case '?': // prevent trigraphs by writing ?? as ?\?
      if (p-2 >= s && *(p-2) == '?') goto QUOTED;
      // else fall through:
    default:
      if (c >= ' ' && c < 127) {
	// a legal ASCII character
	if (linelength >= 78) {fputs("\\\n",code_file); linelength = 0;}
	putc(c, code_file);
	linelength++;
	break;
      }
      // otherwise we must print it as an octal constant:
      c &= 255;
      if (c < 8) {
	if (linelength >= 76) {fputs("\\\n",code_file); linelength = 0;}
	fprintf(code_file, "\\%o",c);
	linelength += 2;
      } else if (c < 64) {
	if (linelength >= 75) {fputs("\\\n",code_file); linelength = 0;}
	fprintf(code_file, "\\%o",c);
	linelength += 3;
      } else {
	if (linelength >= 74) {fputs("\\\n",code_file); linelength = 0;}
	fprintf(code_file, "\\%o",c);
	linelength += 4;
      }
      // We must not put more numbers after it, because some C compilers
      // consume them as part of the quoted sequence.  Use string constant
      // pasting to avoid this:
      c = *p;
      if (p < e && ( (c>='0'&&c<='9') || (c>='a'&&c<='f') || (c>='A'&&c<='F') )) {
	putc('\"', code_file); linelength++;
	if (linelength >= 79) {fputs("\n",code_file); linelength = 0;}
	putc('\"', code_file); linelength++;
      }
      break;
    }
  }
  putc('\"', code_file);
}